

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPoint2PointConstraint.cpp
# Opt level: O0

void __thiscall
btPoint2PointConstraint::getInfo1NonVirtual(btPoint2PointConstraint *this,btConstraintInfo1 *info)

{
  btConstraintInfo1 *info_local;
  btPoint2PointConstraint *this_local;
  
  if ((this->m_useSolveConstraintObsolete & 1U) == 0) {
    info->m_numConstraintRows = 3;
    info->nub = 3;
  }
  else {
    info->m_numConstraintRows = 0;
    info->nub = 0;
  }
  return;
}

Assistant:

void btPoint2PointConstraint::getInfo1NonVirtual (btConstraintInfo1* info)
{
	if (m_useSolveConstraintObsolete)
	{
		info->m_numConstraintRows = 0;
		info->nub = 0;
	} else
	{
		info->m_numConstraintRows = 3;
		info->nub = 3;
	}
}